

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

size_t ntru_encode_schedule_length(NTRUEncodeSchedule *sched)

{
  size_t sVar1;
  size_t sVar2;
  
  if (sched->nops != 0) {
    sVar2 = 0;
    sVar1 = 0;
    do {
      sVar1 = sVar1 + (sched->ops[sVar2] == 1);
      sVar2 = sVar2 + 1;
    } while (sched->nops != sVar2);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t ntru_encode_schedule_length(NTRUEncodeSchedule *sched)
{
    size_t len = 0;
    for (size_t i = 0; i < sched->nops; i++)
        if (sched->ops[i] == ENC_BYTE)
            len++;
    return len;
}